

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_fd.c
# Opt level: O3

int file_open(archive *a,void *client_data)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  stat st;
  stat local_b0;
  
  iVar1 = fstat(*client_data,&local_b0);
  if (iVar1 == 0) {
    uVar4 = local_b0.st_mode & 0xf000;
    if (uVar4 == 0x8000) {
      archive_write_set_skip_file(a,local_b0.st_dev,local_b0.st_ino);
    }
    iVar1 = archive_write_get_bytes_in_last_block(a);
    iVar3 = 0;
    if (iVar1 < 0) {
      if ((((uVar4 == 0x1000) || (uVar4 == 0x2000)) || (uVar4 == 0x6000)) || (*client_data == 1)) {
        iVar1 = 0;
      }
      else {
        iVar1 = 1;
      }
      iVar3 = 0;
      archive_write_set_bytes_in_last_block(a,iVar1);
    }
  }
  else {
    piVar2 = __errno_location();
    archive_set_error(a,*piVar2,"Couldn\'t stat fd %d",(ulong)*client_data);
    iVar3 = -0x1e;
  }
  return iVar3;
}

Assistant:

static int
file_open(struct archive *a, void *client_data)
{
	struct write_fd_data *mine;
	struct stat st;

	mine = (struct write_fd_data *)client_data;

	if (fstat(mine->fd, &st) != 0) {
		archive_set_error(a, errno, "Couldn't stat fd %d", mine->fd);
		return (ARCHIVE_FATAL);
	}

	/*
	 * If this is a regular file, don't add it to itself.
	 */
	if (S_ISREG(st.st_mode))
		archive_write_set_skip_file(a, st.st_dev, st.st_ino);

	/*
	 * If client hasn't explicitly set the last block handling,
	 * then set it here.
	 */
	if (archive_write_get_bytes_in_last_block(a) < 0) {
		/* If the output is a block or character device, fifo,
		 * or stdout, pad the last block, otherwise leave it
		 * unpadded. */
		if (S_ISCHR(st.st_mode) || S_ISBLK(st.st_mode) ||
		    S_ISFIFO(st.st_mode) || (mine->fd == 1))
			/* Last block will be fully padded. */
			archive_write_set_bytes_in_last_block(a, 0);
		else
			archive_write_set_bytes_in_last_block(a, 1);
	}

	return (ARCHIVE_OK);
}